

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O3

void __thiscall FlowInfo::truncateIndirectJump(FlowInfo *this,PcodeOp *op,int4 failuremode)

{
  Funcdata *this_00;
  FuncCallSpecs *pFVar1;
  PcodeOp *op_00;
  string local_48;
  
  Funcdata::opSetOpcode(this->data,op,CPUI_CALLIND);
  setupCallindSpecs(this,op,failuremode == 2,(FuncCallSpecs *)0x0);
  pFVar1 = Funcdata::getCallSpecs(this->data,op);
  pFVar1->isbadjumptable = true;
  op_00 = artificialHalt(this,&(op->start).pc,0);
  PcodeOpBank::insertAfterDead(&this->data->obank,op_00,op);
  this_00 = this->data;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Treating indirect jump as call","");
  Funcdata::warning(this_00,&local_48,&(op->start).pc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FlowInfo::truncateIndirectJump(PcodeOp *op,int4 failuremode)

{
  data.opSetOpcode(op,CPUI_CALLIND); // Turn jump into call
  bool tryoverride = (failuremode == 2);
  setupCallindSpecs(op,tryoverride,(FuncCallSpecs *)0);
  data.getCallSpecs(op)->setBadJumpTable(true);

  // Create an artificial return
  PcodeOp *truncop = artificialHalt(op->getAddr(),0);
  data.opDeadInsertAfter(truncop,op);

  data.warning("Treating indirect jump as call",op->getAddr());
}